

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_sequence_header(SequenceHeader *seq_params,aom_write_bit_buffer *wb)

{
  SequenceHeader *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  aom_wb_write_literal
            ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  aom_wb_write_literal
            ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  aom_wb_write_literal
            ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  aom_wb_write_literal
            ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  if ((*(char *)(in_RDI + 0x3a) == '\0') &&
     (aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x10)),
     *(char *)(in_RDI + 0x10) != '\0')) {
    aom_wb_write_literal
              ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  }
  write_sb_size(in_RSI,(aom_write_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x3c));
  aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x3d));
  if (*(char *)(in_RDI + 0x3a) == '\0') {
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x3e));
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x3f));
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x41));
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x40));
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 0x28));
    if (*(int *)(in_RDI + 0x28) != 0) {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 0x30));
      aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,*(int *)(in_RDI + 0x34));
    }
    if (*(char *)(in_RDI + 0x38) == '\x02') {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,1);
    }
    else {
      aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,0);
      aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x38));
    }
    if (*(char *)(in_RDI + 0x38) != '\0') {
      if (*(char *)(in_RDI + 0x3b) == '\x02') {
        aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,1);
      }
      else {
        aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,0);
        aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x3b));
      }
    }
    if (*(int *)(in_RDI + 0x28) != 0) {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
      ;
    }
  }
  aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x42));
  aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x43));
  aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,(uint)*(byte *)(in_RDI + 0x44));
  return;
}

Assistant:

static inline void write_sequence_header(const SequenceHeader *const seq_params,
                                         struct aom_write_bit_buffer *wb) {
  aom_wb_write_literal(wb, seq_params->num_bits_width - 1, 4);
  aom_wb_write_literal(wb, seq_params->num_bits_height - 1, 4);
  aom_wb_write_literal(wb, seq_params->max_frame_width - 1,
                       seq_params->num_bits_width);
  aom_wb_write_literal(wb, seq_params->max_frame_height - 1,
                       seq_params->num_bits_height);

  if (!seq_params->reduced_still_picture_hdr) {
    aom_wb_write_bit(wb, seq_params->frame_id_numbers_present_flag);
    if (seq_params->frame_id_numbers_present_flag) {
      // We must always have delta_frame_id_length < frame_id_length,
      // in order for a frame to be referenced with a unique delta.
      // Avoid wasting bits by using a coding that enforces this restriction.
      aom_wb_write_literal(wb, seq_params->delta_frame_id_length - 2, 4);
      aom_wb_write_literal(
          wb,
          seq_params->frame_id_length - seq_params->delta_frame_id_length - 1,
          3);
    }
  }

  write_sb_size(seq_params, wb);

  aom_wb_write_bit(wb, seq_params->enable_filter_intra);
  aom_wb_write_bit(wb, seq_params->enable_intra_edge_filter);

  if (!seq_params->reduced_still_picture_hdr) {
    aom_wb_write_bit(wb, seq_params->enable_interintra_compound);
    aom_wb_write_bit(wb, seq_params->enable_masked_compound);
    aom_wb_write_bit(wb, seq_params->enable_warped_motion);
    aom_wb_write_bit(wb, seq_params->enable_dual_filter);

    aom_wb_write_bit(wb, seq_params->order_hint_info.enable_order_hint);

    if (seq_params->order_hint_info.enable_order_hint) {
      aom_wb_write_bit(wb, seq_params->order_hint_info.enable_dist_wtd_comp);
      aom_wb_write_bit(wb, seq_params->order_hint_info.enable_ref_frame_mvs);
    }
    if (seq_params->force_screen_content_tools == 2) {
      aom_wb_write_bit(wb, 1);
    } else {
      aom_wb_write_bit(wb, 0);
      aom_wb_write_bit(wb, seq_params->force_screen_content_tools);
    }
    if (seq_params->force_screen_content_tools > 0) {
      if (seq_params->force_integer_mv == 2) {
        aom_wb_write_bit(wb, 1);
      } else {
        aom_wb_write_bit(wb, 0);
        aom_wb_write_bit(wb, seq_params->force_integer_mv);
      }
    } else {
      assert(seq_params->force_integer_mv == 2);
    }
    if (seq_params->order_hint_info.enable_order_hint)
      aom_wb_write_literal(
          wb, seq_params->order_hint_info.order_hint_bits_minus_1, 3);
  }

  aom_wb_write_bit(wb, seq_params->enable_superres);
  aom_wb_write_bit(wb, seq_params->enable_cdef);
  aom_wb_write_bit(wb, seq_params->enable_restoration);
}